

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PciTopology.h
# Opt level: O0

String __thiscall xmrig::PciTopology::toString(PciTopology *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  char *__s;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar5;
  PciTopology *in_RSI;
  String *in_RDI;
  String SVar6;
  char *buf;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  String *this_00;
  
  this_00 = in_RDI;
  bVar1 = isValid(in_RSI);
  if (bVar1) {
    __s = (char *)operator_new__(8);
    memset(__s,0,8);
    bVar2 = bus(in_RSI);
    uVar3 = (uint)bVar2;
    bVar2 = device(in_RSI);
    uVar4 = (uint)bVar2;
    bVar2 = function(in_RSI);
    snprintf(__s,8,"%02hhx:%02hhx.%01hhx",(ulong)uVar3,(ulong)uVar4,(ulong)bVar2);
    String::String(this_00,(char *)CONCAT44(uVar4,uVar3));
    sVar5 = extraout_RDX_00;
  }
  else {
    String::String(this_00,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sVar5 = extraout_RDX;
  }
  SVar6.m_size = sVar5;
  SVar6.m_data = (char *)in_RDI;
  return SVar6;
}

Assistant:

String toString() const
    {
        if (!isValid()) {
            return "n/a";
        }

        char *buf = new char[8]();
        snprintf(buf, 8, "%02hhx:%02hhx.%01hhx", bus(), device(), function());

        return buf;
    }